

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

void os_sleep(int64_t usecs)

{
  undefined1 local_20 [8];
  timespec ts;
  int64_t usecs_local;
  
  ts.tv_nsec = usecs;
  memset(local_20,0,0x10);
  local_20 = (undefined1  [8])(ts.tv_nsec / 1000000);
  ts.tv_sec = (ts.tv_nsec % 1000000) * 1000;
  clock_nanosleep(1,0,(timespec *)local_20,(timespec *)0x0);
  return;
}

Assistant:

void os_sleep(int64_t usecs) {
#if defined __APPLE__
    usleep(usecs);
#elif defined __unix__
    struct timespec ts = {};
    ts.tv_sec = usecs / NUM_USECS_IN_A_SEC;
    ts.tv_nsec = (usecs - ts.tv_sec * NUM_USECS_IN_A_SEC) * 1000;
    clock_nanosleep(CLOCK_MONOTONIC, 0, &ts, NULL);
#elif defined _WIN64
    //
    // TODO: Windows version has milliseconds resolution
    //
    DWORD milliseconds = (DWORD)(usecs / 1000);
    Sleep(milliseconds);
#else
#error "Unsupported platform"
#endif
}